

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  Returned_column *this;
  lazy_ostream *prev;
  reference witness;
  column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>
  local_200;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
  *local_1d0;
  Returned_column *col;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  assertion_result local_188;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  uint local_150;
  uint i;
  undefined1 local_140 [8];
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>
              *)local_140,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  for (local_150 = 0; uVar3 = (ulong)local_150,
      sVar4 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)&m.matrix_.operators_), uVar3 < sVar4; local_150 = local_150 + 1) {
    if (local_150 == 5) {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_160,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                   ,0x73);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_170);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_160,0x255,&local_170);
        this = Gudhi::persistence_matrix::
               Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
               ::get_column((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
                             *)local_140,local_150);
        bVar2 = Gudhi::persistence_matrix::
                Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
                ::is_empty(this);
        boost::test_tools::assertion_result::assertion_result(&local_188,bVar2);
        prev = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_1b8,"m.get_column(i).is_empty()",0x1a);
        boost::unit_test::operator<<(&local_1a8,prev,&local_1b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&col,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                   ,0x73);
        boost::test_tools::tt_detail::report_assertion(&local_188,&local_1a8,&col,0x255,1,0,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_1a8);
        boost::test_tools::assertion_result::~assertion_result(&local_188);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      local_1d0 = Gudhi::persistence_matrix::
                  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
                  ::get_column((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
                                *)local_140,local_150);
      witness = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)&m.matrix_.operators_,(ulong)local_150);
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>>
                (&local_200,local_1d0);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>>
                (witness,&local_200);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                (&local_200);
    }
  }
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>
             *)local_140);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}